

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall higan::Logger::~Logger(Logger *this)

{
  size_t sVar1;
  ulong uVar2;
  
  (this->buffer_).buffer_[(this->buffer_).write_idx_] = '\n';
  uVar2 = (this->buffer_).write_idx_ + 1;
  if (0x1ff < uVar2) {
    uVar2 = 0x200;
  }
  sVar1 = (this->buffer_).read_idx_;
  (this->buffer_).write_idx_ = uVar2;
  std::function<void_(const_char_*,_unsigned_long)>::operator()
            (&g_output_func,(this->buffer_).buffer_ + sVar1,uVar2 - sVar1);
  if (this->level_ != FATAL) {
    return;
  }
  std::function<void_()>::operator()(&g_flush_func);
  abort();
}

Assistant:

Logger::~Logger()
{
	*buffer_.WriteBegin() = '\n';
	buffer_.AddWriteIndex(1);

	g_output_func(buffer_.ReadBegin(), buffer_.ReadableSize());

	if (level_ == FATAL)
	{
		g_flush_func();
		abort();
	}
}